

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMan.c
# Opt level: O0

void Gia_ManLogAigStats(Gia_Man_t *p,char *pDumpFile)

{
  uint uVar1;
  FILE *__stream;
  FILE *pTable;
  char *pDumpFile_local;
  Gia_Man_t *p_local;
  
  __stream = fopen(pDumpFile,"wb");
  fprintf(__stream,"{\n");
  fprintf(__stream,"    \"name\" : \"%s\",\n",p->pName);
  uVar1 = Gia_ManCiNum(p);
  fprintf(__stream,"    \"input\" : %d,\n",(ulong)uVar1);
  uVar1 = Gia_ManCoNum(p);
  fprintf(__stream,"    \"output\" : %d,\n",(ulong)uVar1);
  uVar1 = Gia_ManAndNum(p);
  fprintf(__stream,"    \"and\" : %d,\n",(ulong)uVar1);
  uVar1 = Gia_ManLevelNum(p);
  fprintf(__stream,"    \"level\" : %d\n",(ulong)uVar1);
  fprintf(__stream,"}\n");
  fclose(__stream);
  return;
}

Assistant:

void Gia_ManLogAigStats( Gia_Man_t * p, char * pDumpFile )
{
    FILE * pTable = fopen( pDumpFile, "wb" );
    fprintf( pTable, "{\n" );
    fprintf( pTable, "    \"name\" : \"%s\",\n", p->pName );
    fprintf( pTable, "    \"input\" : %d,\n",    Gia_ManCiNum(p) );
    fprintf( pTable, "    \"output\" : %d,\n",   Gia_ManCoNum(p) );
    fprintf( pTable, "    \"and\" : %d,\n",      Gia_ManAndNum(p) );
    fprintf( pTable, "    \"level\" : %d\n",     Gia_ManLevelNum(p) );
    fprintf( pTable, "}\n" );
    fclose( pTable );
}